

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O1

bool __thiscall xercesc_4_0::CMStateSet::operator==(CMStateSet *this,CMStateSet *setToCompare)

{
  CMDynamicBuffer *pCVar1;
  ulong uVar2;
  XMLInt32 *pXVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  if (this->fBitCount == setToCompare->fBitCount) {
    pCVar1 = this->fDynamicBuffer;
    if (pCVar1 != (CMDynamicBuffer *)0x0) {
      uVar2 = pCVar1->fArraySize;
      bVar7 = uVar2 != 0;
      if (bVar7) {
        uVar5 = 0;
        do {
          pXVar3 = setToCompare->fDynamicBuffer->fBitArray[uVar5];
          if (pCVar1->fBitArray[uVar5] == (XMLInt32 *)0x0) {
            iVar6 = 1;
            if (pXVar3 == (XMLInt32 *)0x0) {
              iVar6 = 7;
            }
          }
          else {
            iVar6 = 1;
            if (pXVar3 != (XMLInt32 *)0x0) {
              lVar4 = 0;
              do {
                if (pCVar1->fBitArray[uVar5][lVar4] != pXVar3[lVar4]) goto LAB_002f396f;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0x20);
              iVar6 = 0;
            }
          }
LAB_002f396f:
          if ((iVar6 != 7) && (iVar6 != 0)) {
            if (!bVar7) {
              return true;
            }
            return false;
          }
          uVar5 = uVar5 + 1;
          bVar7 = uVar5 < uVar2;
        } while (uVar5 != uVar2);
      }
      return true;
    }
    if (this->fBits[0] == setToCompare->fBits[0]) {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (uVar5 == 3) {
          return true;
        }
        uVar2 = uVar5 + 1;
      } while (this->fBits[uVar5 + 1] == setToCompare->fBits[uVar5 + 1]);
      if (2 < uVar5) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const CMStateSet& setToCompare) const
    {
        if (fBitCount != setToCompare.fBitCount)
            return false;

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
            {
                if (fBits[index] != setToCompare.fBits[index])
                    return false;
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToCompare.fDynamicBuffer->fBitArray[index],
                         *& mine = fDynamicBuffer->fBitArray[index];
                if(mine==NULL && other==NULL)
                    continue;
                else if(mine==NULL || other==NULL) // the other should have been empty too
                    return false;
                else
                {
                    for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        if(mine[subIndex]!=other[subIndex])
                            return false;
                }
            }
        }
        return true;
    }